

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

bool __thiscall Lexer::isWord(Lexer *this,string *token,Type *type)

{
  char cVar1;
  bool bVar2;
  size_t sVar3;
  size_t marker;
  size_t local_50;
  string local_48 [32];
  
  if (this->_enableWord == true) {
    local_50 = this->_cursor;
    while (((cVar1 = (this->_text)._M_dataplus._M_p[local_50], sVar3 = local_50, cVar1 != '\0' &&
            (bVar2 = unicodeWhitespace((int)cVar1), sVar3 = local_50, !bVar2)) &&
           ((this->_enableOperator != true ||
            (bVar2 = isSingleCharOperator((int)(this->_text)._M_dataplus._M_p[local_50]), !bVar2))))
          ) {
      utf8_next_char(&this->_text,&local_50);
    }
    bVar2 = this->_cursor < sVar3;
    if (bVar2) {
      std::__cxx11::string::substr((ulong)local_48,(ulong)this);
      std::__cxx11::string::operator=((string *)token,local_48);
      std::__cxx11::string::~string(local_48);
      *type = word;
      this->_cursor = local_50;
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool Lexer::isWord (std::string& token, Lexer::Type& type)
{
  if (_enableWord)
  {
    std::size_t marker = _cursor;

    while (_text[marker] &&
           ! unicodeWhitespace (_text[marker]) &&
           (! _enableOperator || ! isSingleCharOperator (_text[marker])))
      utf8_next_char (_text, marker);

    if (marker > _cursor)
    {
      token = _text.substr (_cursor, marker - _cursor);
      type = Lexer::Type::word;
      _cursor = marker;
      return true;
    }
  }

  return false;
}